

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeBackgroundMatrices.hpp
# Opt level: O1

vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
* njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::BackgroundChannels::makeBackgroundMatrices
            (vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
             *__return_storage_ptr__,uint NCH,
            vector<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
            *channels)

{
  uint uVar1;
  pointer pvVar2;
  pointer poVar3;
  uint args_1;
  undefined8 *puVar4;
  pointer __variants;
  allocator_type local_169;
  value_type local_168;
  
  local_168.
  super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
  .
  super__Optional_payload_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>
  ._M_engaged = false;
  std::
  vector<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)NCH,&local_168,&local_169);
  if (local_168.
      super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>
      ._M_engaged == true) {
    local_168.
    super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
    .
    super__Optional_payload_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>
    ._M_engaged = false;
    std::__detail::__variant::
    _Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>
    ::~_Variant_storage((_Variant_storage<false,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>
                         *)&local_168);
  }
  __variants = (channels->
               super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (channels->
           super__Vector_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__variants != pvVar2) {
    do {
      args_1 = std::
               visit<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::BackgroundChannels::makeBackgroundMatrices(unsigned_int,std::vector<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>,std::allocator<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>>&&)::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>&>
                         ((anon_class_1_0_00000001 *)&local_168,__variants);
      uVar1 = args_1 - 1;
      if (NCH <= uVar1) {
        tools::Log::error<char_const*>("Encountered illegal LCH value");
        tools::Log::info<char_const*>("LCH must be between 1 and NCH");
        tools::Log::info<char_const*,unsigned_int>("NCH value: {}",NCH);
LAB_001432db:
        tools::Log::info<char_const*,unsigned_int>("LCH value: {}",args_1);
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = getenv;
        __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
      }
      poVar3 = (__return_storage_ptr__->
               super__Vector_base<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>,_std::allocator<std::optional<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(bool *)((long)&poVar3[uVar1].
                           super__Optional_base<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::variant<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::SammyBackgroundRMatrix,_njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::FrohnerBackgroundRMatrix>,_true,_false,_false>
                   + 0x130) == true) {
        tools::Log::error<char_const*>("Encountered duplicate LCH value");
        goto LAB_001432db;
      }
      std::
      optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
      ::operator=((optional<std::variant<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::NoBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::SammyBackgroundRMatrix,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::FrohnerBackgroundRMatrix>>
                   *)(poVar3 + uVar1),__variants);
      __variants = __variants + 1;
    } while (__variants != pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< std::optional< BackgroundRMatrix > >
makeBackgroundMatrices( unsigned int NCH,
                        std::vector< BackgroundRMatrix >&& channels ) {

  std::vector< std::optional< BackgroundRMatrix > >
  background( NCH, std::nullopt );

  for ( auto&& rmatrix : channels ) {

    unsigned int LCH = std::visit( [] ( const auto& variant )
                                      { return variant.LCH(); },
                                   rmatrix );
    if ( ( LCH <= 0 ) || ( LCH > NCH ) ) {

      Log::error( "Encountered illegal LCH value" );
      Log::info( "LCH must be between 1 and NCH" );
      Log::info( "NCH value: {}", NCH );
      Log::info( "LCH value: {}", LCH );
      throw std::exception();
    }

    if ( background[ LCH - 1 ] ) {

      Log::error( "Encountered duplicate LCH value" );
      Log::info( "LCH value: {}", LCH );
      throw std::exception();
    }
    background[ LCH - 1 ] = std::move( rmatrix );
  }
  return background;
}